

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureBarrierBasicOutline::render(TextureBarrierBasicOutline *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar4;
  
  iVar2 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  for (iVar4 = 0; iVar4 < 0x6000; iVar4 = iVar4 + iVar1) {
    iVar3 = (iVar4 % 0x17) * 3 + 0xdb6;
    iVar1 = 0x6000 - iVar4;
    if (iVar3 <= 0x6000 - iVar4) {
      iVar1 = iVar3;
    }
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x538))(4,iVar4,iVar1);
  }
  return;
}

Assistant:

void render()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Issue the whole grid using multiple separate draw commands
		int minTriCountPerDraw = TRIANGLE_COUNT / 7;
		int first = 0, count = 0;
		while (first < VERTEX_COUNT)
		{
			// Pseudo-random number of vertices per draw
			count = deMin32(VERTEX_COUNT - first, (first % 23 + minTriCountPerDraw) * 3);

			gl.drawArrays(GL_TRIANGLES, first, count);

			first += count;
		}
	}